

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsBody::ChShaftsBody(ChShaftsBody *this,ChShaftsBody *other)

{
  undefined1 auVar1 [16];
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChShaftsBody_00b23f30;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = 0.0;
  auVar1 = ZEXT416(0) << 0x40;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)auVar1._0_8_;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)auVar1._8_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b3ae50;
  (this->constraint).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint).Cq_a.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint).Cq_b.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  (this->constraint).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint).Eq_a.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  (this->constraint).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->constraint).Eq_b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  *(undefined1 (*) [16])(this->shaft_dir).m_data = auVar1;
  (this->shaft_dir).m_data[2] = 0.0;
  this->torque_react = other->torque_react;
  if (other != this) {
    (this->shaft_dir).m_data[0] = (other->shaft_dir).m_data[0];
    (this->shaft_dir).m_data[1] = (other->shaft_dir).m_data[1];
    (this->shaft_dir).m_data[2] = (other->shaft_dir).m_data[2];
  }
  this->shaft = (ChShaft *)auVar1._0_8_;
  this->body = (ChBodyFrame *)auVar1._8_8_;
  return;
}

Assistant:

ChShaftsBody::ChShaftsBody(const ChShaftsBody& other) : ChPhysicsItem(other) {
    torque_react = other.torque_react;
    shaft_dir = other.shaft_dir;
    shaft = NULL;
    body = NULL;
}